

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

void __thiscall Assimp::Q3BSPFileParser::getLumps(Q3BSPFileParser *this)

{
  value_type psVar1;
  sQ3BSPLump *psVar2;
  reference ppsVar3;
  sQ3BSPLump *pLump;
  size_t idx;
  size_t Offset;
  Q3BSPFileParser *this_local;
  
  idx = this->m_sOffset;
  std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::resize
            (&this->m_pModel->m_Lumps,0x11);
  for (pLump = (sQ3BSPLump *)0x0; pLump < (sQ3BSPLump *)0x11;
      pLump = (sQ3BSPLump *)((long)&pLump->iOffset + 1)) {
    psVar1 = (value_type)operator_new(8);
    psVar2 = (sQ3BSPLump *)std::vector<char,_std::allocator<char>_>::operator[](&this->m_Data,idx);
    *psVar1 = *psVar2;
    idx = idx + 8;
    ppsVar3 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
              ::operator[](&this->m_pModel->m_Lumps,(size_type)pLump);
    *ppsVar3 = psVar1;
  }
  return;
}

Assistant:

void Q3BSPFileParser::getLumps()
{
    size_t Offset = m_sOffset;
    m_pModel->m_Lumps.resize( kMaxLumps );
    for ( size_t idx=0; idx < kMaxLumps; idx++ )
    {
        sQ3BSPLump *pLump = new sQ3BSPLump;
        memcpy( pLump, &m_Data[ Offset ], sizeof( sQ3BSPLump ) );
        Offset += sizeof( sQ3BSPLump );
        m_pModel->m_Lumps[ idx ] = pLump;
    }
}